

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

Index __thiscall
PlanningUnitMADPDiscrete::ComputeHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index t,Index t_offset,Index *indices,
          size_t indexDomainSize)

{
  undefined1 auVar1 [16];
  long lVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  
  auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,indexDomainSize);
  iVar3 = t - 1;
  uVar5 = (ulong)t_offset;
  for (lVar4 = 0; (ulong)t << 2 != lVar4; lVar4 = lVar4 + 4) {
    auVar6._0_8_ = pow(auVar1._0_8_,(double)iVar3);
    auVar6._8_56_ = extraout_var;
    lVar2 = vcvttsd2usi_avx512f(auVar6._0_16_);
    iVar3 = iVar3 + -1;
    uVar5 = uVar5 + (ulong)*(uint *)((long)indices + lVar4) * lVar2;
  }
  return (Index)uVar5;
}

Assistant:

Index PlanningUnitMADPDiscrete::ComputeHistoryIndex(
        Index t,    //the stage
        Index t_offset, //for each stage t, there is an offset
        //const vector<Index>& indices, //the indices of the (J)(A/O)s
        const Index indices [], //the indices of the (J)(A/O)s
        size_t indexDomainSize //the indices range from 0...(indexDomainSize-1)
        ) const
{
    //This example assumes we are computing the index of an observation history:
    //
    //indices is a vector with the observation indices for stage 0...t-1
    //<o^0, o^1, ... , o^(t-1) >
    //from this we want to find the history observation index, which is given
    //by:
    //      o^0 * |O|^(t-1) + ... + o^(t-1) * |O|^0     + stage offset
    //
    //where |O| is the `base' of the number as specified by the tuple of 
    //indices
    //
    size_t HI=t_offset;
    for (Index ts=0; ts<t; ts++)
    {
        int exponent = t-1 - ts;
        size_t b = (size_t) pow((double)indexDomainSize, (double)(exponent));
        HI += indices[ts] * b;
    }
    return(HI);
}